

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtraCommands.cpp
# Opt level: O0

ResponseLine * __thiscall
JoinGenericCommand::trigger(JoinGenericCommand *this,string_view parameters)

{
  bool bVar1;
  ResponseLine *pRVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  size_t local_e0;
  char *local_d8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  JoinGenericCommand *local_90;
  size_t local_88;
  undefined1 local_80 [8];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  char *local_58;
  size_t local_40;
  char *local_38;
  long local_30;
  IRC_Bot *server;
  JoinGenericCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (JoinGenericCommand *)parameters._M_len;
  if (IRCCommand::selected_server == 0) {
    if (IRCCommand::active_server == 0) {
      pRVar2 = (ResponseLine *)operator_new(0x30);
      bVar3 = sv("Error: No IRC server is currently selected.",0x2b);
      local_40 = bVar3._M_len;
      local_38 = bVar3._M_str;
      Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,local_40,local_38,2);
      return pRVar2;
    }
    local_30 = IRCCommand::active_server;
  }
  else {
    local_30 = IRCCommand::selected_server;
  }
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    pRVar2 = (ResponseLine *)operator_new(0x30);
    join_0x00000010_0x00000000_ =
         sv("Error: Too Few Parameters. Syntax: join <channel> [password]",0x3c);
    Jupiter::GenericCommand::ResponseLine::ResponseLine
              (pRVar2,parameters_split.second._M_str,local_58,2);
    parameters_local._M_str = (char *)pRVar2;
  }
  else {
    local_90 = this_local;
    local_88 = parameters_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0," \t");
    jessilib::
    word_split_once_view<,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
              ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)local_80,(jessilib *)&local_90,&local_a0,in_RCX);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)
                       &parameters_split.first._M_str);
    if (bVar1) {
      Jupiter::IRC::Client::joinChannel(local_30,this_local,parameters_local._M_len);
    }
    else {
      Jupiter::IRC::Client::joinChannel
                (local_30,local_80,parameters_split.first._M_len,parameters_split.first._M_str,
                 parameters_split.second._M_len);
    }
    pRVar2 = (ResponseLine *)operator_new(0x30);
    bVar3 = sv("Request to join channel has been sent.",0x26);
    local_e0 = bVar3._M_len;
    local_d8 = bVar3._M_str;
    Jupiter::GenericCommand::ResponseLine::ResponseLine(pRVar2,local_e0,local_d8,0);
    parameters_local._M_str = (char *)pRVar2;
  }
  return (ResponseLine *)parameters_local._M_str;
}

Assistant:

Jupiter::GenericCommand::ResponseLine *JoinGenericCommand::trigger(std::string_view parameters)
{
	IRC_Bot *server;
	if (IRCCommand::selected_server != nullptr)
		server = IRCCommand::selected_server;
	else if (IRCCommand::active_server != nullptr)
		server = IRCCommand::active_server;
	else
		return new Jupiter::GenericCommand::ResponseLine("Error: No IRC server is currently selected."sv, GenericCommand::DisplayType::PublicError);

	if (parameters.empty())
		return new Jupiter::GenericCommand::ResponseLine("Error: Too Few Parameters. Syntax: join <channel> [password]"sv, GenericCommand::DisplayType::PublicError);

	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (parameters_split.second.empty()) {
		server->joinChannel(parameters);
	}
	else {
		server->joinChannel(parameters_split.first, parameters_split.second);
	}

	return new Jupiter::GenericCommand::ResponseLine("Request to join channel has been sent."sv, GenericCommand::DisplayType::PublicSuccess);
}